

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

void JS_NewGlobalCConstructor2(JSContext *ctx,JSValue func_obj,char *name,JSValue proto)

{
  int iVar1;
  JSValueUnion JVar2;
  
  JVar2 = func_obj.u;
  if ((uint)func_obj.tag < 0xfffffff5) {
    JS_DefinePropertyValueStr(ctx,ctx->global_obj,name,func_obj,3);
    JS_SetConstructor2(ctx,func_obj,proto,0,3);
  }
  else {
    *(int *)JVar2.ptr = *JVar2.ptr + 1;
    JS_DefinePropertyValueStr(ctx,ctx->global_obj,name,func_obj,3);
    JS_SetConstructor2(ctx,func_obj,proto,0,3);
    iVar1 = *JVar2.ptr;
    *(int *)JVar2.ptr = iVar1 + -1;
    if (iVar1 < 2) {
      __JS_FreeValueRT(ctx->rt,func_obj);
      return;
    }
  }
  return;
}

Assistant:

static void JS_NewGlobalCConstructor2(JSContext *ctx,
                                      JSValue func_obj,
                                      const char *name,
                                      JSValueConst proto)
{
    JS_DefinePropertyValueStr(ctx, ctx->global_obj, name,
                           JS_DupValue(ctx, func_obj),
                           JS_PROP_WRITABLE | JS_PROP_CONFIGURABLE);
    JS_SetConstructor(ctx, func_obj, proto);
    JS_FreeValue(ctx, func_obj);
}